

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.cpp
# Opt level: O2

void R_ClearPastViewer(AActor *actor)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  
  TArray<DVector3a,_DVector3a>::Clear(&InterpolationPath);
  lVar3 = 0;
  uVar1 = PastViewers.Count;
  for (uVar2 = 0; uVar2 < uVar1; uVar2 = uVar2 + 1) {
    if (*(AActor **)((long)&(PastViewers.Array)->ViewActor + lVar3) == actor) {
      TArray<InterpolationViewer,_InterpolationViewer>::Pop
                (&PastViewers,(InterpolationViewer *)((long)&(PastViewers.Array)->ViewActor + lVar3)
                );
      uVar1 = PastViewers.Count;
    }
    lVar3 = lVar3 + 0x80;
  }
  return;
}

Assistant:

void R_ClearPastViewer (AActor *actor)
{
	InterpolationPath.Clear();
	for (unsigned int i = 0; i < PastViewers.Size(); ++i)
	{
		if (PastViewers[i].ViewActor == actor)
		{
			// Found it, so remove it.
			if (i == PastViewers.Size())
			{
				PastViewers.Delete (i);
			}
			else
			{
				PastViewers.Pop (PastViewers[i]);
			}
		}
	}
}